

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O1

bool __thiscall Directory::create(Directory *this,int mode)

{
  bool bVar1;
  int iVar2;
  Directory parent_dir;
  string local_90;
  File local_70;
  
  Path::parent_abi_cxx11_(&local_90,&(this->super_File).super_Path);
  Path::Path(&local_70.super_Path,&local_90);
  local_70._fh = (FILE *)0x0;
  local_70._h = -1;
  local_70._locked = false;
  local_70._vptr_File = (_func_int **)&PTR__File_001a1af0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  iVar2 = access(local_70.super_Path._data._M_dataplus._M_p,0);
  if (iVar2 != 0) {
    bVar1 = create((Directory *)&local_70,mode);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0016ca3e;
    }
  }
  iVar2 = mkdir((this->super_File).super_Path._data._M_dataplus._M_p,mode);
  bVar1 = iVar2 == 0;
LAB_0016ca3e:
  File::~File(&local_70);
  return bVar1;
}

Assistant:

bool Directory::create (int mode /* = 0755 */)
{
  // No error handling because we want failure to be silent, somewhat emulating
  // "mkdir -p".
  Directory parent_dir = parent ();
  if (! parent_dir.exists ())
  {
      if (! parent_dir.create (mode))
      {
          return false;
      }
  }
  return mkdir (_data.c_str (), mode) == 0;
}